

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

MemoryStreamReaderPtr __thiscall
Assimp::Ogre::OgreBinarySerializer::OpenReader
          (OgreBinarySerializer *this,IOSystem *pIOHandler,string *filename)

{
  string *pFile;
  string *this_00;
  bool bVar1;
  Logger *pLVar2;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar3;
  basic_formatter *pbVar4;
  IOStream *pIVar5;
  DeadlyImportError *this_01;
  StreamReader<false,_false> *this_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  MemoryStreamReaderPtr MVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  allocator local_3b1;
  string local_3b0;
  IOStream *local_390;
  IOStream *f;
  string local_210;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  string local_78;
  allocator local_41;
  string local_40;
  string *local_20;
  string *filename_local;
  IOSystem *pIOHandler_local;
  
  local_20 = filename;
  filename_local = (string *)pIOHandler;
  pIOHandler_local = (IOSystem *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,".skeleton",&local_41);
  bVar1 = EndsWith(filename,&local_40,false);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    bVar1 = IOSystem::Exists((IOSystem *)filename_local,local_20);
    this_00 = filename_local;
    pFile = local_20;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3b0,"rb",&local_3b1);
      pIVar5 = IOSystem::Open((IOSystem *)this_00,pFile,&local_3b0);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
      local_390 = pIVar5;
      if (pIVar5 == (IOStream *)0x0) {
        this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::operator+(&local_3d8,"Failed to open skeleton file ",local_20);
        DeadlyImportError::DeadlyImportError(this_01,&local_3d8);
        __cxa_throw(this_01,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      this_02 = (StreamReader<false,_false> *)operator_new(0x38);
      StreamReader<false,_false>::StreamReader(this_02,local_390,false);
      std::shared_ptr<Assimp::StreamReader<false,false>>::
      shared_ptr<Assimp::StreamReader<false,false>,void>
                ((shared_ptr<Assimp::StreamReader<false,false>> *)this,this_02);
      _Var6._M_pi = extraout_RDX_01;
    }
    else {
      pLVar2 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[31]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                 (char (*) [31])"Failed to find skeleton file \'");
      pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&f,
                         local_20);
      pbVar4 = (basic_formatter *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar3,(char (*) [39])"\' that is referenced by imported Mesh.");
      Formatter::basic_formatter::operator_cast_to_string(&local_210,pbVar4);
      Logger::error(pLVar2,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&f);
      std::shared_ptr<Assimp::StreamReader<false,_false>_>::shared_ptr
                ((shared_ptr<Assimp::StreamReader<false,_false>_> *)this);
      _Var6._M_pi = extraout_RDX_00;
    }
  }
  else {
    pLVar2 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[46]>
              (&local_1f0,(char (*) [46])"Imported Mesh is referencing to unsupported \'");
    pbVar3 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_1f0,local_20);
    pbVar4 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                       (pbVar3,(char (*) [17])"\' skeleton file.");
    Formatter::basic_formatter::operator_cast_to_string(&local_78,pbVar4);
    Logger::error(pLVar2,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    ~basic_formatter(&local_1f0);
    std::shared_ptr<Assimp::StreamReader<false,_false>_>::shared_ptr
              ((shared_ptr<Assimp::StreamReader<false,_false>_> *)this);
    _Var6._M_pi = extraout_RDX;
  }
  MVar7.super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  MVar7.super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (MemoryStreamReaderPtr)
         MVar7.super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MemoryStreamReaderPtr OgreBinarySerializer::OpenReader(Assimp::IOSystem *pIOHandler, const std::string &filename)
{
    if (!EndsWith(filename, ".skeleton", false))
    {
        ASSIMP_LOG_ERROR_F("Imported Mesh is referencing to unsupported '", filename, "' skeleton file.");
        return MemoryStreamReaderPtr();
    }

    if (!pIOHandler->Exists(filename))
    {
        ASSIMP_LOG_ERROR_F("Failed to find skeleton file '", filename, "' that is referenced by imported Mesh.");
        return MemoryStreamReaderPtr();
    }

    IOStream *f = pIOHandler->Open(filename, "rb");
    if (!f) {
        throw DeadlyImportError("Failed to open skeleton file " + filename);
    }

    return MemoryStreamReaderPtr(new MemoryStreamReader(f));
}